

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.h
# Opt level: O2

_Bool bitset_next_set_bit(bitset_t *bitset,size_t *i)

{
  long lVar1;
  ulong uVar2;
  ulong uVar3;
  uint64_t uVar4;
  
  uVar3 = *i;
  uVar2 = uVar3 >> 6;
  if (bitset->arraysize <= uVar2) {
    return false;
  }
  uVar4 = bitset->array[uVar2] >> ((byte)uVar3 & 0x3f);
  if (uVar4 == 0) {
    uVar3 = uVar2 << 6;
    do {
      uVar2 = uVar2 + 1;
      if (bitset->arraysize <= uVar2) {
        return false;
      }
      uVar4 = bitset->array[uVar2];
      uVar3 = uVar3 + 0x40;
    } while (uVar4 == 0);
  }
  lVar1 = 0;
  if (uVar4 != 0) {
    for (; (uVar4 >> lVar1 & 1) == 0; lVar1 = lVar1 + 1) {
    }
  }
  *i = lVar1 + uVar3;
  return true;
}

Assistant:

inline bool bitset_next_set_bit(const bitset_t *bitset, size_t *i) {
    size_t x = *i / 64;
    if (x >= bitset->arraysize) {
        return false;
    }
    uint64_t w = bitset->array[x];
    w >>= (*i & 63);
    if (w != 0) {
        *i += roaring_trailing_zeroes(w);
        return true;
    }
    x++;
    while (x < bitset->arraysize) {
        w = bitset->array[x];
        if (w != 0) {
            *i = x * 64 + roaring_trailing_zeroes(w);
            return true;
        }
        x++;
    }
    return false;
}